

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::reduceDB_Core(Solver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  if (0 < this->verbosity) {
    printf("c Core size before reduce: %i\n",(ulong)(uint)(this->learnts_core).sz);
  }
  sort<unsigned_int,reduceDB_c>
            ((this->learnts_core).data,(this->learnts_core).sz,(reduceDB_c)&this->ca);
  iVar7 = (this->learnts_core).sz;
  if (iVar7 < 1) {
    iVar10 = 0;
    lVar13 = 0;
  }
  else {
    iVar12 = (this->learnts_core).sz / 2;
    lVar11 = 0;
    lVar13 = 0;
    iVar10 = 0;
    do {
      puVar4 = (this->learnts_core).data;
      uVar2 = *(uint *)((long)puVar4 + lVar11);
      puVar5 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar6 = *(ulong *)(puVar5 + uVar2);
      if ((~(uint)uVar6 & 3) == 0) {
        puVar1 = (ulong *)(puVar5 + uVar2);
        if (0x40 < ((uint)uVar6 & 0x3fffffe0)) {
          if ((uVar6 & 0xfffffffc00000000) == 0x800000000) {
            uVar9 = (ulong)((this->assigns).data[(int)puVar1[1] >> 1].value !=
                           ((byte)(int)puVar1[1] & 1));
          }
          else {
            uVar9 = 0;
          }
          iVar7 = *(int *)((long)puVar1 + uVar9 * 4 + 8);
          iVar8 = iVar7 >> 1;
          if (((((this->assigns).data[iVar8].value != ((byte)iVar7 & 1)) ||
               (uVar3 = (this->vardata).data[iVar8].reason, uVar3 == 0xffffffff || uVar3 != uVar2))
              && ((ulong)(*(int *)((long)puVar1 + (uVar6 >> 0x22) * 4 + 0xc) + 100000) <
                  this->conflicts)) && (lVar13 < iVar12)) {
            vec<unsigned_int>::push(&this->learnts_tier2,(uint *)((long)puVar4 + lVar11));
            uVar6 = *puVar1;
            *puVar1 = uVar6 & 0xfffffffffffffffc | 2;
            *(int *)((long)puVar1 + (uVar6 >> 0x22) * 4 + 0xc) = (int)this->conflicts;
            goto LAB_00116832;
          }
        }
        puVar4[iVar10] = uVar2;
        uVar6 = *puVar1;
        if ((uVar6 & 0xfffffffc00000000) == 0x800000000) {
          uVar9 = (ulong)((this->assigns).data[(int)puVar1[1] >> 1].value !=
                         ((byte)(int)puVar1[1] & 1));
        }
        else {
          uVar9 = 0;
        }
        iVar10 = iVar10 + 1;
        iVar7 = *(int *)((long)puVar1 + uVar9 * 4 + 8);
        iVar8 = iVar7 >> 1;
        if ((((this->assigns).data[iVar8].value == ((byte)iVar7 & 1)) &&
            (uVar3 = (this->vardata).data[iVar8].reason, uVar3 != 0xffffffff && uVar3 == uVar2)) ||
           ((((uint)uVar6 & 0x3fffffe0) < 0x60 ||
            ((ulong)(*(int *)((long)puVar1 + (uVar6 >> 0x22) * 4 + 0xc) + 50000) < this->conflicts))
           )) {
          iVar12 = iVar12 + 1;
        }
      }
LAB_00116832:
      lVar13 = lVar13 + 1;
      iVar7 = (this->learnts_core).sz;
      lVar11 = lVar11 + 4;
    } while (lVar13 < iVar7);
  }
  iVar12 = (int)lVar13 - iVar10;
  if (iVar12 != 0 && iVar10 <= (int)lVar13) {
    (this->learnts_core).sz = iVar7 - iVar12;
  }
  if (0 < this->verbosity) {
    printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n",
           (ulong)(uint)(this->learnts_core).sz,(ulong)((double)iVar10 < (double)iVar7 * 0.95));
  }
  return (double)iVar10 < (double)iVar7 * 0.95;
}

Assistant:

bool Solver::reduceDB_Core()
{
    if (verbosity > 0) printf("c Core size before reduce: %i\n", learnts_core.size());
    int i, j;
    bool ret = false;
    sort(learnts_core, reduceDB_c(ca));
    int limit = learnts_core.size() / 2;

    for (i = j = 0; i < learnts_core.size(); i++) {
        Clause &c = ca[learnts_core[i]];
        if (c.mark() == CORE) {
            if (c.lbd() > 2 && !locked(c) && (c.touched() + 100000 < conflicts) && i < limit) {
                learnts_tier2.push(learnts_core[i]);
                c.mark(TIER2);
                // c.removable(true);
                // c.activity() = 0;
                c.touched() = conflicts;
                // claBumpActivity(c);
            } else {
                learnts_core[j++] = learnts_core[i];
                if (locked(c) || (c.touched() + 50000 < conflicts) || c.lbd() <= 2) {
                    limit++;
                }
            }
        }
    }
    ret = j < learnts_core.size() * 0.95;
    learnts_core.shrink(i - j);
    if (verbosity > 0)
        printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n", learnts_core.size(), ret);

    return ret;
}